

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject_p.h
# Opt level: O3

bool comparesEqual(QArgumentType *lhs,QArgumentType *rhs)

{
  QMetaTypeInterface *pQVar1;
  QMetaTypeInterface *pQVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  size_t __n;
  char *__s2;
  char *__s1;
  long in_FS_OFFSET;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (lhs->_metaType).d_ptr;
  if (pQVar1 == (QMetaTypeInterface *)0x0) {
    __n = (lhs->_name).d.size;
    if (__n == 0) {
LAB_002853e7:
      __s1 = (char *)0x0;
      __n = 0;
    }
    else {
LAB_002853f6:
      __s1 = (lhs->_name).d.ptr;
    }
  }
  else {
    pQVar2 = (rhs->_metaType).d_ptr;
    if (pQVar2 != (QMetaTypeInterface *)0x0) {
      local_18.d_ptr = pQVar2;
      local_10.d_ptr = pQVar1;
      bVar4 = comparesEqual(&local_10,&local_18);
      goto LAB_0028544e;
    }
    __n = (lhs->_name).d.size;
    if (__n != 0) goto LAB_002853f6;
    __s1 = pQVar1->name;
    if (__s1 == (char *)0x0) goto LAB_002853e7;
    __n = 0xffffffffffffffff;
    do {
      lVar3 = __n + 1;
      __n = __n + 1;
    } while (__s1[lVar3] != '\0');
  }
  sVar6 = (rhs->_name).d.size;
  if (sVar6 == 0) {
    pQVar1 = (rhs->_metaType).d_ptr;
    if ((pQVar1 == (QMetaTypeInterface *)0x0) || (__s2 = pQVar1->name, __s2 == (char *)0x0)) {
      __s2 = (char *)0x0;
      sVar6 = 0;
    }
    else {
      sVar6 = 0xffffffffffffffff;
      do {
        lVar3 = sVar6 + 1;
        sVar6 = sVar6 + 1;
      } while (__s2[lVar3] != '\0');
    }
  }
  else {
    __s2 = (rhs->_name).d.ptr;
  }
  if (__n == sVar6) {
    if (__n == 0) {
      bVar4 = true;
    }
    else {
      iVar5 = bcmp(__s1,__s2,__n);
      bVar4 = iVar5 == 0;
    }
  }
  else {
    bVar4 = false;
  }
LAB_0028544e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool comparesEqual(const QArgumentType &lhs,
                              const QArgumentType &rhs)
    {
        if (lhs.metaType().isValid() && rhs.metaType().isValid())
            return lhs.metaType() == rhs.metaType();
        else
            return lhs.name() == rhs.name();
    }